

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::ProcessLineDefs(UDMFParser *this)

{
  bool bVar1;
  sector_t_conflict *sec;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  line_t_conflict *plVar7;
  vertex_t *pvVar8;
  ulong uVar9;
  ulong uVar10;
  side_t *psVar11;
  intmapsidedef_t *msd;
  double dVar12;
  double dVar13;
  side_t *local_d0;
  line_t_conflict *local_a8;
  int local_54;
  int mapside;
  int sd;
  short tempalpha [2];
  int side;
  int line;
  int local_34;
  vertex_t *local_30;
  intptr_t v2i;
  intptr_t v1i;
  uint local_18;
  uint skipped;
  uint i;
  int sidecount;
  UDMFParser *this_local;
  
  skipped = 0;
  local_18 = 0;
  v1i._4_4_ = 0;
  _i = this;
  do {
    while( true ) {
      while( true ) {
        uVar4 = local_18;
        uVar5 = TArray<line_t,_line_t>::Size(&this->ParsedLines);
        if (uVar5 <= uVar4) {
          numlines = TArray<line_t,_line_t>::Size(&this->ParsedLines);
          numsides = skipped;
          uVar9 = (ulong)numlines;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar9;
          uVar10 = SUB168(auVar2 * ZEXT816(0x98),0);
          if (SUB168(auVar2 * ZEXT816(0x98),8) != 0) {
            uVar10 = 0xffffffffffffffff;
          }
          plVar7 = (line_t_conflict *)operator_new__(uVar10);
          if (uVar9 != 0) {
            local_a8 = plVar7;
            do {
              line_t::line_t((line_t *)local_a8);
              local_a8 = local_a8 + 1;
            } while (local_a8 != plVar7 + uVar9);
          }
          uVar9 = (ulong)numsides;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar9;
          uVar10 = SUB168(auVar3 * ZEXT816(0xc0),0);
          if (SUB168(auVar3 * ZEXT816(0xc0),8) != 0) {
            uVar10 = 0xffffffffffffffff;
          }
          lines = plVar7;
          psVar11 = (side_t *)operator_new__(uVar10);
          if (uVar9 != 0) {
            local_d0 = psVar11;
            do {
              side_t::side_t(local_d0);
              local_d0 = local_d0 + 1;
            } while (local_d0 != psVar11 + uVar9);
          }
          tempalpha[0] = 0;
          tempalpha[1] = 0;
          sd = 0;
          sides = psVar11;
          for (; (int)tempalpha < numlines; tempalpha = (short  [2])((int)tempalpha + 1)) {
            mapside = -0x7fff8000;
            plVar7 = TArray<line_t,_line_t>::operator[](&this->ParsedLines,(long)(int)tempalpha);
            line_t::operator=((line_t *)(lines + (int)tempalpha),plVar7);
            for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
              if (lines[(int)tempalpha].sidedef[local_54] != (side_t *)0x0) {
                iVar6 = (int)lines[(int)tempalpha].sidedef[local_54] + -1;
                if (iVar6 < (int)skipped) {
                  psVar11 = TArray<side_t,_side_t>::operator[](&this->ParsedSides,(long)iVar6);
                  memcpy(sides + sd,psVar11,0xbc);
                  sides[sd].linedef = lines + (int)tempalpha;
                  sides[sd].sector = sectors + (long)sides[sd].sector;
                  lines[(int)tempalpha].sidedef[local_54] = sides + sd;
                  bVar1 = this->isExtended;
                  psVar11 = sides + sd;
                  sec = sides[sd].sector;
                  msd = TArray<intmapsidedef_t,_intmapsidedef_t>::operator[]
                                  (&this->ParsedSideTextures,(long)iVar6);
                  P_ProcessSideTextures
                            ((bool)((bVar1 ^ 0xffU) & 1),psVar11,sec,msd,
                             lines[(int)tempalpha].special,lines[(int)tempalpha].args[0],
                             (short *)((long)&mapside + (long)local_54 * 2),this->missingTex);
                  sd = sd + 1;
                }
                else {
                  lines[(int)tempalpha].sidedef[local_54] = (side_t *)0x0;
                }
              }
            }
            P_AdjustLine(lines + (int)tempalpha);
            P_FinishLoadingLineDef(lines + (int)tempalpha,(int)(short)mapside);
          }
          if (numsides < sd) {
            __assert_fail("side <= numsides",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_udmf.cpp"
                          ,0x720,"void UDMFParser::ProcessLineDefs()");
          }
          if (sd < numsides) {
            Printf("Map had %d invalid side references\n",(ulong)(uint)(numsides - sd));
            numsides = sd;
          }
          return;
        }
        plVar7 = TArray<line_t,_line_t>::operator[](&this->ParsedLines,(ulong)local_18);
        v2i = (intptr_t)plVar7->v1;
        plVar7 = TArray<line_t,_line_t>::operator[](&this->ParsedLines,(ulong)local_18);
        local_30 = plVar7->v2;
        if ((((v2i < numvertexes) && ((long)local_30 < (long)numvertexes)) && (-1 < v2i)) &&
           (-1 < (long)local_30)) break;
        I_Error("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.",
                (ulong)(local_18 + v1i._4_4_),v2i,local_30,(ulong)(uint)numvertexes);
      }
      if ((vertex_t *)v2i != local_30) break;
LAB_0061658f:
      Printf("Removing 0-length line %d\n",(ulong)(local_18 + v1i._4_4_));
      TArray<line_t,_line_t>::Delete(&this->ParsedLines,local_18);
      ForceNodeBuild = true;
      v1i._4_4_ = v1i._4_4_ + 1;
    }
    dVar12 = vertex_t::fX(vertexes + v2i);
    dVar13 = vertex_t::fX(vertexes + (long)local_30);
    if ((dVar12 == dVar13) && (!NAN(dVar12) && !NAN(dVar13))) {
      dVar12 = vertex_t::fY(vertexes + v2i);
      dVar13 = vertex_t::fY(vertexes + (long)local_30);
      if ((dVar12 == dVar13) && (!NAN(dVar12) && !NAN(dVar13))) goto LAB_0061658f;
    }
    pvVar8 = vertexes + v2i;
    plVar7 = TArray<line_t,_line_t>::operator[](&this->ParsedLines,(ulong)local_18);
    plVar7->v1 = pvVar8;
    pvVar8 = vertexes + (long)local_30;
    plVar7 = TArray<line_t,_line_t>::operator[](&this->ParsedLines,(ulong)local_18);
    plVar7->v2 = pvVar8;
    plVar7 = TArray<line_t,_line_t>::operator[](&this->ParsedLines,(ulong)local_18);
    if (plVar7->sidedef[0] != (side_t *)0x0) {
      skipped = skipped + 1;
    }
    plVar7 = TArray<line_t,_line_t>::operator[](&this->ParsedLines,(ulong)local_18);
    if (plVar7->sidedef[1] != (side_t *)0x0) {
      skipped = skipped + 1;
    }
    local_34 = local_18 + v1i._4_4_;
    TArray<int,_int>::Push(&linemap,&local_34);
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void ProcessLineDefs()
	{
		int sidecount = 0;
		for(unsigned i = 0, skipped = 0; i < ParsedLines.Size();)
		{
			// Relocate the vertices
			intptr_t v1i = intptr_t(ParsedLines[i].v1);
			intptr_t v2i = intptr_t(ParsedLines[i].v2);

			if (v1i >= numvertexes || v2i >= numvertexes || v1i < 0 || v2i < 0)
			{
				I_Error ("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.", i+skipped, v1i, v2i, numvertexes);
			}
			else if (v1i == v2i ||
				(vertexes[v1i].fX() == vertexes[v2i].fX() && vertexes[v1i].fY() == vertexes[v2i].fY()))
			{
				Printf ("Removing 0-length line %d\n", i+skipped);
				ParsedLines.Delete(i);
				ForceNodeBuild = true;
				skipped++;
			}
			else
			{
				ParsedLines[i].v1 = &vertexes[v1i];
				ParsedLines[i].v2 = &vertexes[v2i];

				if (ParsedLines[i].sidedef[0] != NULL)
					sidecount++;
				if (ParsedLines[i].sidedef[1] != NULL)
					sidecount++;
				linemap.Push(i+skipped);
				i++;
			}
		}
		numlines = ParsedLines.Size();
		numsides = sidecount;
		lines = new line_t[numlines];
		sides = new side_t[numsides];
		int line, side;

		for(line = 0, side = 0; line < numlines; line++)
		{
			short tempalpha[2] = { SHRT_MIN, SHRT_MIN };

			lines[line] = ParsedLines[line];

			for(int sd = 0; sd < 2; sd++)
			{
				if (lines[line].sidedef[sd] != NULL)
				{
					int mapside = int(intptr_t(lines[line].sidedef[sd]))-1;
					if (mapside < sidecount)
					{
						sides[side] = ParsedSides[mapside];
						sides[side].linedef = &lines[line];
						sides[side].sector = &sectors[intptr_t(sides[side].sector)];
						lines[line].sidedef[sd] = &sides[side];

						P_ProcessSideTextures(!isExtended, &sides[side], sides[side].sector, &ParsedSideTextures[mapside],
							lines[line].special, lines[line].args[0], &tempalpha[sd], missingTex);

						side++;
					}
					else
					{
						lines[line].sidedef[sd] = NULL;
					}
				}
			}

			P_AdjustLine(&lines[line]);
			P_FinishLoadingLineDef(&lines[line], tempalpha[0]);
		}
		assert(side <= numsides);
		if (side < numsides)
		{
			Printf("Map had %d invalid side references\n", numsides - side);
			numsides = side;
		}
	}